

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

bool ON_IsAnnotationFractionNumber
               (double value,bool bImproperFraction,double *sign,double *proper,double *numerator,
               double *denominator)

{
  double dVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double __x;
  double dVar6;
  double dVar7;
  double i;
  double local_38;
  
  if (sign != (double *)0x0) {
    *sign = (double)(-(ulong)(value < 0.0) & 0xbff0000000000000 |
                    ~-(ulong)(value < 0.0) & -(ulong)(0.0 < value) & 0x3ff0000000000000);
  }
  if (proper != (double *)0x0) {
    *proper = 0.0;
  }
  if (numerator != (double *)0x0) {
    *numerator = value;
  }
  if (denominator != (double *)0x0) {
    *denominator = 1.0;
  }
  bVar2 = ON_IsValid(value);
  if (bVar2) {
    local_38 = 0.0;
    dVar5 = modf(ABS(value),&local_38);
    dVar7 = ABS(value) * 8.881784197001252e-16;
    if (dVar7 < dVar5) {
      lVar3 = 0;
      do {
        dVar1 = *(double *)((long)&DAT_006cde40 + lVar3);
        __x = dVar5 * dVar1;
        dVar6 = floor(__x);
        uVar4 = -(ulong)(0.5 < __x - dVar6);
        dVar6 = (double)(~uVar4 & (ulong)dVar6 | (ulong)(dVar6 + 1.0) & uVar4);
        if (ABS(dVar6 - __x) <= dVar7) {
          dVar5 = local_38;
          if (!bImproperFraction && 1.0 <= local_38) {
            dVar5 = 0.0;
          }
          if (proper != (double *)0x0 && (!bImproperFraction && 1.0 <= local_38)) {
            *proper = local_38;
            dVar5 = 0.0;
          }
          if (numerator != (double *)0x0) {
            *numerator = dVar5 * dVar1 + dVar6;
          }
          if (denominator == (double *)0x0) {
            return true;
          }
          *denominator = dVar1;
          return true;
        }
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x48);
    }
  }
  return false;
}

Assistant:

static
bool ON_IsAnnotationFractionNumber(
  double value,
  bool bImproperFraction,
  double* sign,
  double* proper,
  double* numerator,
  double* denominator
)
{
  if (nullptr != sign)
    *sign = (value < 0.0) ? -1.0 : ((value > 0.0) ? 1.0 : 0.0);
  if (nullptr != proper)
    *proper = 0.0;
  if (nullptr != numerator)
    *numerator = value;
  if (nullptr != denominator)
    *denominator = 1.0;
  if (!ON_IsValid(value))
    return false;

  const double a = fabs(value);
  double i = 0.0;
  const double f = modf(a, &i);

  const double tol = 4.0*ON_EPSILON*a;

  if ( !(f > tol) )
    return false;

  // terminate this list with 0.0.
  const double d[] = { 2.0, 3.0, 4.0, 8.0, 10.0, 16.0, 32.0, 64.0, 128.0, 0.0 };
  for (size_t k = 0; d[k] > 0.0; k++)
  {
    const double y = d[k] * f;
    double x = floor(y);
    if (y - x > 0.5)
      x += 1.0;
    if (!(fabs(x - y) <= tol))
      continue;
    if (false == bImproperFraction && i >= 1.0)
    {
      if (nullptr != proper)
        *proper = i;
      i = 0.0;
    }
    if (nullptr != numerator)
      *numerator = i*d[k] + x;
    if (nullptr != denominator)
      *denominator = d[k];
    return true;
  }

  return false;
}